

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLock::ArchiveIN(ChLinkLock *this,ChArchiveIn *marchive)

{
  LinkType link_type;
  ChLinkForce *force_D_ptr;
  LinkType_mapper typemapper;
  ChFunctorArchiveInSpecificPtr<chrono::ChLinkForce> specFuncA;
  LinkType local_84;
  pointer local_80;
  ChEnumMapper<chrono::ChLinkLock::LinkType> local_78;
  LinkType_mapper local_58;
  undefined **local_38;
  ChEnumMapper<chrono::ChLinkLock::LinkType> *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkLock>(marchive);
  ChLinkMarkers::ArchiveIN(&this->super_ChLinkMarkers,marchive);
  my_enum_mappers_types::LinkType_mapper::LinkType_mapper(&local_58);
  my_enum_mappers_types::LinkType_mapper::operator()(&local_78,&local_58,&local_84);
  local_38 = (undefined **)0x9643db;
  local_28 = 0;
  local_30 = &local_78;
  (**(code **)(*(long *)marchive + 0x58))(marchive,&local_38);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b16bb0
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ChangeLinkType(this,local_84);
  local_78.value_ptr = (LinkType *)&this->d_restlength;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9643e5;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_30 = (ChEnumMapper<chrono::ChLinkLock::LinkType> *)&local_80;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x964400;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_38 = &PTR__ChFunctorArchiveIn_00b16e78;
  local_78.value_ptr = (LinkType *)&local_38;
  (**(code **)(*(long *)marchive + 0x68))(marchive);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_D,local_80);
  local_58.super_ChEnumMapper<chrono::ChLinkLock::LinkType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b16bb0;
  if (local_58.super_ChEnumMapper<chrono::ChLinkLock::LinkType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super_ChEnumMapper<chrono::ChLinkLock::LinkType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChLinkLock::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkLock>();

    // deserialize parent class
    ChLinkMarkers::ArchiveIN(marchive);

    // deserialize all member data
    my_enum_mappers_types::LinkType_mapper typemapper;
    LinkType link_type;
    marchive >> CHNVP(typemapper(link_type), "link_type");
    ChangeLinkType(link_type);

    ////if (mask) delete (mask); marchive >> CHNVP(mask); //// TODO: needed?

    marchive >> CHNVP(d_restlength);

    {
        ChLinkForce* force_D_ptr;
        marchive >> CHNVP(force_D_ptr);
        force_D.reset(force_D_ptr);
    }
    ////marchive >> CHNVP(force_D);
    ////marchive >> CHNVP(force_R);
    ////marchive >> CHNVP(force_X);
    ////marchive >> CHNVP(force_Y);
    ////marchive >> CHNVP(force_Z);
    ////marchive >> CHNVP(force_Rx);
    ////marchive >> CHNVP(force_Ry);
    ////marchive >> CHNVP(force_Rz);

    ////marchive >> CHNVP(limit_X);
    ////marchive >> CHNVP(limit_Y);
    ////marchive >> CHNVP(limit_Z);
    ////marchive >> CHNVP(limit_Rx);
    ////marchive >> CHNVP(limit_Ry);
    ////marchive >> CHNVP(limit_Rz);
    ////marchive >> CHNVP(limit_Rp);
    ////marchive >> CHNVP(limit_D);
}